

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roll-parser.cpp
# Opt level: O2

string * __thiscall
ORPG::ExpressionTree::tree_string
          (string *__return_storage_ptr__,ExpressionTree *this,parse_node *node,int indent,
          string *pre)

{
  parse_node *ppVar1;
  ExpressionTree *this_00;
  parse_node *node_00;
  int iVar2;
  bool bVar3;
  string pad;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  ExpressionTree *local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_118 = this;
  std::__cxx11::string::string((string *)&local_f0,"",(allocator *)&local_138);
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_138);
  iVar2 = 0;
  if (0 < indent) {
    iVar2 = indent;
  }
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    std::__cxx11::string::append((char *)&local_f0);
  }
  std::operator+(&local_70,&local_f0,pre);
  std::operator+(&local_50,&local_70,"(");
  node_to_string_abi_cxx11_(&local_90,(ORPG *)node,node_00);
  std::operator+(&local_110,&local_50,&local_90);
  std::operator+(&local_138,&local_110,")\n");
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  this_00 = local_118;
  ppVar1 = node->left;
  if (ppVar1 != (parse_node *)0x0) {
    std::__cxx11::string::string((string *)&local_b0,"left->",(allocator *)&local_110);
    tree_string(&local_138,this_00,ppVar1,indent + 2,&local_b0);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  ppVar1 = node->right;
  if (ppVar1 != (parse_node *)0x0) {
    std::__cxx11::string::string((string *)&local_d0,"right->",(allocator *)&local_110);
    tree_string(&local_138,this_00,ppVar1,indent + 2,&local_d0);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  std::__cxx11::string::~string((string *)&local_f0);
  return __return_storage_ptr__;
}

Assistant:

string ExpressionTree::tree_string(struct parse_node* node, int indent, string pre) {
        int i;
        string pad("");
        string ret("");

        for(i = 0; i < indent; i++) pad += " ";

        ret = pad + pre + "(" + node_to_string(node) +")\n";

        if(node->left != NULL)  ret += tree_string(node->left, indent + 2, "left->");
        if(node->right != NULL) ret += tree_string(node->right, indent + 2, "right->");

        return ret;
    }